

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void rd_pick_rect_partition
               (AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,
               PICK_MODE_CONTEXT *cur_partition_ctx,PartitionSearchState *part_search_state,
               RD_STATS *best_rdc,int idx,int mi_row,int mi_col,BLOCK_SIZE bsize,
               PARTITION_TYPE partition_type)

{
  RD_STATS best_rd;
  AV1_COMP *in_RCX;
  PICK_MODE_CONTEXT *unaff_RBX;
  PARTITION_TYPE in_SIL;
  BLOCK_SIZE in_DIL;
  TileDataEnc *in_R8;
  MACROBLOCK *in_R9;
  uint uVar1;
  undefined8 unaff_R14;
  undefined8 unaff_retaddr;
  int in_stack_00000008;
  undefined1 in_stack_0000000c [20];
  byte in_stack_00000028;
  RECT_PART_TYPE rect_part;
  RD_STATS best_remain_rdcost;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  RD_STATS *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  RD_STATS *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  
  av1_rd_stats_subtraction
            ((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),in_stack_ffffffffffffff58,
             (RD_STATS *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (RD_STATS *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  uVar1 = (uint)in_stack_00000028;
  best_rd.rdcost._0_4_ = in_stack_00000008;
  best_rd.dist = unaff_retaddr;
  best_rd._20_20_ = in_stack_0000000c;
  best_rd.rate = (int)unaff_R14;
  best_rd.zero_rate = (int)((ulong)unaff_R14 >> 0x20);
  pick_sb_modes(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                in_stack_ffffffffffffffb0,in_SIL,in_DIL,unaff_RBX,best_rd);
  av1_rd_cost_update(in_stack_ffffffffffffff54,(RD_STATS *)CONCAT44(in_stack_ffffffffffffff4c,uVar1)
                    );
  if (*(int *)((in_R8->tctx).txb_skip_cdf[0][9] + 1) == 0x7fffffff) {
    *(undefined8 *)((in_R8->tctx).txb_skip_cdf[1][5] + 2) = 0x7fffffffffffffff;
  }
  else {
    *(int *)(in_R8->tctx).txb_skip_cdf[1][3] =
         *(int *)((in_R8->tctx).txb_skip_cdf[0][9] + 1) + *(int *)(in_R8->tctx).txb_skip_cdf[1][3];
    *(long *)((in_R8->tctx).txb_skip_cdf[1][4] + 1) =
         *(long *)((in_R8->tctx).txb_skip_cdf[0][10] + 2) +
         *(long *)((in_R8->tctx).txb_skip_cdf[1][4] + 1);
    av1_rd_cost_update(in_stack_ffffffffffffff54,
                       (RD_STATS *)CONCAT44(in_stack_ffffffffffffff4c,uVar1));
  }
  *(undefined8 *)
   ((long)(in_R8->tctx).txb_skip_cdf[2] +
   (long)in_stack_00000008 * 8 + (ulong)(in_stack_00000028 != 1) * 0x10 + 0x2c) =
       *(undefined8 *)((in_R8->tctx).txb_skip_cdf[0] + 0xc);
  return;
}

Assistant:

static void rd_pick_rect_partition(AV1_COMP *const cpi, TileDataEnc *tile_data,
                                   MACROBLOCK *x,
                                   PICK_MODE_CONTEXT *cur_partition_ctx,
                                   PartitionSearchState *part_search_state,
                                   RD_STATS *best_rdc, const int idx,
                                   int mi_row, int mi_col, BLOCK_SIZE bsize,
                                   PARTITION_TYPE partition_type) {
  // Obtain the remainder from the best rd cost
  // for further processing of partition.
  RD_STATS best_remain_rdcost;
  av1_rd_stats_subtraction(x->rdmult, best_rdc, &part_search_state->sum_rdc,
                           &best_remain_rdcost);

  // Obtain the best mode for the partition sub-block.
  pick_sb_modes(cpi, tile_data, x, mi_row, mi_col, &part_search_state->this_rdc,
                partition_type, bsize, cur_partition_ctx, best_remain_rdcost);
  av1_rd_cost_update(x->rdmult, &part_search_state->this_rdc);

  // Update the partition rd cost with the current sub-block rd.
  if (part_search_state->this_rdc.rate == INT_MAX) {
    part_search_state->sum_rdc.rdcost = INT64_MAX;
  } else {
    part_search_state->sum_rdc.rate += part_search_state->this_rdc.rate;
    part_search_state->sum_rdc.dist += part_search_state->this_rdc.dist;
    av1_rd_cost_update(x->rdmult, &part_search_state->sum_rdc);
  }
  const RECT_PART_TYPE rect_part =
      partition_type == PARTITION_HORZ ? HORZ : VERT;
  part_search_state->rect_part_rd[rect_part][idx] =
      part_search_state->this_rdc.rdcost;
}